

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CSTORCommand::doWhat(CSTORCommand *this,CClient *pClient)

{
  undefined8 this_00;
  EFTPSTATE EVar1;
  int iVar2;
  char *pcVar3;
  CPasvDataTransfer *pCVar4;
  ostream *poVar5;
  CPortDataTransfer *this_01;
  allocator local_221;
  undefined1 local_220 [8];
  string ret_2;
  CPortDataTransfer *c;
  undefined1 local_1f0 [8];
  string ret_1;
  undefined1 local_1c8 [4];
  int port;
  string ip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  int local_128;
  allocator local_121;
  int r_1;
  string msg_1;
  undefined1 local_f8 [8];
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  int local_58;
  int r;
  allocator local_41;
  undefined1 local_40 [8];
  string msg;
  CClient *pClient_local;
  CSTORCommand *this_local;
  
  msg.field_2._8_8_ = pClient;
  EVar1 = CClient::GetClientState(pClient);
  if (EVar1 == PASV) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,"RECVFILE#",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    CClient::GetUserDir_abi_cxx11_(&local_78,(CClient *)msg.field_2._8_8_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = chdir(pcVar3);
    std::__cxx11::string::~string((string *)&local_78);
    local_58 = iVar2;
    if (iVar2 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    CClient::GetUserDir_abi_cxx11_(&local_98,(CClient *)msg.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ret.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"#"
                  );
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ret.field_2 + 8),&(this->super_CCommand).m_Args);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)(ret.field_2._M_local_buf + 8));
    pCVar4 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
    CPasvDataTransfer::SetMsg(pCVar4,(string *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_f8,"150 Ok to send data.\r\n",
               (allocator *)(msg_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(msg_1.field_2._M_local_buf + 0xf));
    CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_f8);
    pCVar4 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
    iVar2 = CClient::GetClientfd((CClient *)msg.field_2._8_8_);
    CPasvDataTransfer::SetControlSock(pCVar4,iVar2);
    pCVar4 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
    CPasvDataTransfer::PostSignal(pCVar4);
    CClient::SetClientState((CClient *)msg.field_2._8_8_,PASS);
    CClient::SetClientPasvDataTransfer((CClient *)msg.field_2._8_8_,(CPasvDataTransfer *)0x0);
    this_local._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    EVar1 = CClient::GetClientState((CClient *)msg.field_2._8_8_);
    if (EVar1 == PORT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&r_1,"RECVFILE#",&local_121);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      CClient::GetUserDir_abi_cxx11_(&local_148,(CClient *)msg.field_2._8_8_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = chdir(pcVar3);
      std::__cxx11::string::~string((string *)&local_148);
      local_128 = iVar2;
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Current user dir is error,now program will exit.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        exit(-1);
      }
      CClient::GetUserDir_abi_cxx11_(&local_168,(CClient *)msg.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)&r_1,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ip.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r_1,"#");
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ip.field_2 + 8),&(this->super_CCommand).m_Args);
      std::__cxx11::string::operator=((string *)&r_1,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)(ip.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_1c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1f0,"150 Ok to send data.\r\n",(allocator *)((long)&c + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
      CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_1f0);
      ret_1.field_2._12_4_ =
           CClient::GetClientPortIpAndPort((CClient *)msg.field_2._8_8_,(string *)local_1c8);
      this_01 = (CPortDataTransfer *)operator_new(0x60);
      CPortDataTransfer::CPortDataTransfer(this_01,(string *)local_1c8,ret_1.field_2._12_4_);
      ret_2.field_2._8_8_ = this_01;
      CPortDataTransfer::SetMsg(this_01,(string *)&r_1);
      this_00 = ret_2.field_2._8_8_;
      iVar2 = CClient::GetClientfd((CClient *)msg.field_2._8_8_);
      CPortDataTransfer::SetControlSock((CPortDataTransfer *)this_00,iVar2);
      CThread::Run((CThread *)ret_2.field_2._8_8_);
      CClient::SetClientState((CClient *)msg.field_2._8_8_,PASS);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::~string((string *)&r_1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_220,"425 Use PORT or PASV first.\r\n",&local_221)
      ;
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_220);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_220);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CSTORCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;
            pClient->GetClientPasvDataTransfer()->SetMsg(msg);
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
            pClient->GetClientPasvDataTransfer()->PostSignal();

            pClient->SetClientState(PASS);
            pClient->SetClientPasvDataTransfer(NULL);
            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;

            string ip;
            int port;
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            port = pClient->GetClientPortIpAndPort(ip);
            CPortDataTransfer *c = new CPortDataTransfer(ip,port);
            c->SetMsg(msg);
            c->SetControlSock(pClient->GetClientfd());
            c->Run();
            pClient->SetClientState(PASS);

            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}